

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O0

Type * __thiscall soul::heart::ArrayElement::getType(ArrayElement *this)

{
  bool bVar1;
  int iVar2;
  Expression *pEVar3;
  undefined4 extraout_var;
  bool local_72;
  bool local_71;
  Type local_60;
  Type local_38;
  size_t local_20;
  size_t sliceSize;
  Type *aggregateType;
  ArrayElement *this_local;
  
  aggregateType = (Type *)this;
  pEVar3 = pool_ref<soul::heart::Expression>::operator->(&this->parent);
  iVar2 = (*(pEVar3->super_Object)._vptr_Object[2])();
  sliceSize = CONCAT44(extraout_var,iVar2);
  local_20 = getSliceSize(this);
  if (local_20 == 1) {
    bVar1 = Type::isPrimitive((Type *)sliceSize);
    if (bVar1) {
      Type::operator=(&this->temporaryType,(Type *)sliceSize);
    }
    else {
      Type::getElementType(&local_38,(Type *)sliceSize);
      Type::operator=(&this->temporaryType,&local_38);
      Type::~Type(&local_38);
    }
  }
  else {
    bVar1 = Type::isArray((Type *)sliceSize);
    local_71 = true;
    if (!bVar1) {
      local_71 = Type::isVector((Type *)sliceSize);
    }
    checkAssertion(local_71,"aggregateType.isArray() || aggregateType.isVector()","getType",0x21a);
    bVar1 = Type::isUnsizedArray((Type *)sliceSize);
    local_72 = true;
    if (!bVar1) {
      local_72 = Type::isValidArrayOrVectorRange<unsigned_long>
                           ((Type *)sliceSize,this->fixedStartIndex,this->fixedEndIndex);
    }
    checkAssertion(local_72,
                   "aggregateType.isUnsizedArray() || aggregateType.isValidArrayOrVectorRange (fixedStartIndex, fixedEndIndex)"
                   ,"getType",0x21b);
    Type::createCopyWithNewArraySize(&local_60,(Type *)sliceSize,local_20);
    Type::operator=(&this->temporaryType,&local_60);
    Type::~Type(&local_60);
  }
  return &this->temporaryType;
}

Assistant:

const Type& getType() const override
        {
            const auto& aggregateType = parent->getType();
            auto sliceSize = getSliceSize();

            if (sliceSize == 1)
            {
                if (aggregateType.isPrimitive())
                    temporaryType = aggregateType;
                else
                    temporaryType = aggregateType.getElementType();
            }
            else
            {
                SOUL_ASSERT (aggregateType.isArray() || aggregateType.isVector());
                SOUL_ASSERT (aggregateType.isUnsizedArray() || aggregateType.isValidArrayOrVectorRange (fixedStartIndex, fixedEndIndex));

                temporaryType = aggregateType.createCopyWithNewArraySize (sliceSize);
            }

            return temporaryType;
        }